

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationOperation.cpp
# Opt level: O1

MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_> *
__thiscall
vkt::synchronization::anon_unknown_0::Draw::Support::build
          (MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
           *__return_storage_ptr__,Support *this,OperationContext *context,Resource *resource)

{
  VertexGrid *this_00;
  DrawCall DVar1;
  VkFormat format;
  DeviceInterface *vk;
  VkDevice device;
  Allocator *allocator;
  _func_int *p_Var2;
  undefined4 *puVar3;
  _func_int **pp_Var4;
  VkImage image;
  _func_int **pp_Var5;
  VkImageSubresourceRange subresourceRange;
  VkClearDepthStencilValue *pVVar6;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *pUVar7;
  OperationContext *pOVar8;
  int iVar9;
  Operation *pOVar10;
  Buffer *pBVar11;
  GraphicsPipelineBuilder *pGVar12;
  const_iterator cVar13;
  TextureFormat TVar14;
  PixelBufferAccess imagePixels;
  GraphicsPipelineBuilder pipelineBuilder;
  undefined1 local_1d8 [8];
  undefined1 auStack_1d0 [16];
  undefined2 uStack_1c0;
  undefined6 uStack_1be;
  TextureFormat *local_1a8;
  TextureFormat *local_1a0;
  undefined1 local_198 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
  *local_178;
  TextureFormat *local_170;
  TextureFormat *local_168;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_160;
  VkClearDepthStencilValue *local_158;
  OperationContext *local_150;
  VertexGrid *local_148;
  MovePtr<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  *local_140;
  GraphicsPipelineBuilder local_138;
  
  local_140 = __return_storage_ptr__;
  pOVar10 = (Operation *)operator_new(0x158);
  DVar1 = this->m_drawCall;
  pOVar10->_vptr_Operation = (_func_int **)&PTR__Implementation_00d30df0;
  pOVar10[1]._vptr_Operation = (_func_int **)context;
  pOVar10[2]._vptr_Operation = (_func_int **)resource;
  *(DrawCall *)&pOVar10[3]._vptr_Operation = DVar1;
  this_00 = (VertexGrid *)(pOVar10 + 4);
  VertexGrid::VertexGrid(this_00,context);
  local_160 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)(pOVar10 + 0xc);
  local_178 = (UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
               *)(pOVar10 + 0xf);
  local_168 = (TextureFormat *)(pOVar10 + 0x13);
  pOVar10[0x15]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x16]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x13]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x14]._vptr_Operation = (_func_int **)0x0;
  local_1a0 = (TextureFormat *)(pOVar10 + 0x1b);
  local_170 = (TextureFormat *)(pOVar10 + 0x1f);
  local_1a8 = (TextureFormat *)(pOVar10 + 0x23);
  local_158 = (VkClearDepthStencilValue *)(pOVar10 + 0x27);
  pOVar10[0xc]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0xd]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0xe]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0xf]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x1b]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x1c]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x1d]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x1e]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x1f]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x20]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x21]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x22]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x23]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x24]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x25]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x26]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x27]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x28]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x29]._vptr_Operation = (_func_int **)0x0;
  pOVar10[0x2a]._vptr_Operation = (_func_int **)0x0;
  vk = context->m_vk;
  device = context->m_device;
  allocator = context->m_allocator;
  local_150 = context;
  local_148 = this_00;
  if (*(int *)&pOVar10[3]._vptr_Operation == 3) {
    pBVar11 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_138,0x14,0x100);
    synchronization::Buffer::Buffer
              (pBVar11,vk,device,allocator,(VkBufferCreateInfo *)&local_138,(MemoryRequirement)0x1);
    pUVar7 = local_178;
    local_1d8._0_4_ = R;
    local_1d8._4_4_ = SNORM_INT8;
    if ((local_178->m_data).ptr != pBVar11) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(local_178);
      (pUVar7->m_data).ptr = pBVar11;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
           *)local_1d8);
    p_Var2 = pOVar10[0xf]._vptr_Operation[4];
    puVar3 = *(undefined4 **)(p_Var2 + 0x18);
    *puVar3 = (int)((ulong)((long)pOVar10[6]._vptr_Operation - (long)pOVar10[5]._vptr_Operation) >>
                   4);
    *(undefined8 *)(puVar3 + 1) = 1;
    *(undefined8 *)(puVar3 + 3) = 0;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
               0x14);
  }
  else if (*(int *)&pOVar10[3]._vptr_Operation == 2) {
    pBVar11 = (Buffer *)operator_new(0x30);
    makeBufferCreateInfo((VkBufferCreateInfo *)&local_138,0x10,0x100);
    synchronization::Buffer::Buffer
              (pBVar11,vk,device,allocator,(VkBufferCreateInfo *)&local_138,(MemoryRequirement)0x1);
    pUVar7 = local_178;
    local_1d8._0_4_ = R;
    local_1d8._4_4_ = SNORM_INT8;
    if ((local_178->m_data).ptr != pBVar11) {
      de::details::
      UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
      reset(local_178);
      (pUVar7->m_data).ptr = pBVar11;
    }
    de::details::
    UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>::
    reset((UniqueBase<vkt::synchronization::Buffer,_de::DefaultDeleter<vkt::synchronization::Buffer>_>
           *)local_1d8);
    p_Var2 = pOVar10[0xf]._vptr_Operation[4];
    puVar3 = *(undefined4 **)(p_Var2 + 0x18);
    *puVar3 = (int)((ulong)((long)pOVar10[6]._vptr_Operation - (long)pOVar10[5]._vptr_Operation) >>
                   4);
    *(undefined8 *)(puVar3 + 1) = 1;
    puVar3[3] = 0;
    ::vk::flushMappedMemoryRange
              (vk,device,(VkDeviceMemory)*(deUint64 *)(p_Var2 + 8),*(VkDeviceSize *)(p_Var2 + 0x10),
               0x10);
  }
  pp_Var4 = pOVar10[2]._vptr_Operation;
  format = *(VkFormat *)(pp_Var4 + 0xb);
  *(VkFormat *)&pOVar10[0x11]._vptr_Operation = format;
  pp_Var5 = *(_func_int ***)((long)pp_Var4 + 100);
  pOVar10[0x17]._vptr_Operation = *(_func_int ***)((long)pp_Var4 + 0x5c);
  pOVar10[0x18]._vptr_Operation = pp_Var5;
  *(undefined4 *)&pOVar10[0x19]._vptr_Operation = *(undefined4 *)((long)pp_Var4 + 0x6c);
  image.m_internal = (deUint64)pp_Var4[8];
  pOVar10[0x12]._vptr_Operation = (_func_int **)image.m_internal;
  *(undefined4 *)((long)&pOVar10[0x1a]._vptr_Operation + 4) = *(undefined4 *)(pp_Var4 + 10);
  *(_func_int **)((long)&pOVar10[0x19]._vptr_Operation + 4) = pp_Var4[9];
  subresourceRange.baseArrayLayer = (int)((ulong)pOVar10[0x18]._vptr_Operation >> 0x20);
  subresourceRange._0_12_ = *(undefined1 (*) [12])(pOVar10 + 0x17);
  subresourceRange.layerCount = *(deUint32 *)&pOVar10[0x19]._vptr_Operation;
  makeImageView((Move<vk::Handle<(vk::HandleType)13>_> *)local_1d8,vk,device,image,
                VK_IMAGE_VIEW_TYPE_2D,format,subresourceRange);
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)auStack_1d0._8_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)_uStack_1c0;
  local_138.m_renderSize.m_data[0] = local_1d8._0_4_;
  local_138.m_renderSize.m_data[1] = local_1d8._4_4_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = auStack_1d0._0_8_;
  local_1d8._0_4_ = R;
  local_1d8._4_4_ = SNORM_INT8;
  auStack_1d0._0_4_ = R;
  auStack_1d0._4_4_ = SNORM_INT8;
  auStack_1d0._8_8_ = (VkDevice)0x0;
  _uStack_1c0 = (VkAllocationCallbacks *)0x0;
  if (*local_168 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)(pOVar10 + 0x14),(VkImageView)*local_168)
    ;
  }
  local_168[2] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_deviceIface;
  local_168[3] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_device;
  local_168->order = local_138.m_renderSize.m_data[0];
  local_168->type = local_138.m_renderSize.m_data[1];
  local_168[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_168[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  if ((TextureFormat)local_1d8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)13>_> *)auStack_1d0,(VkImageView)local_1d8);
  }
  makeRenderPass((Move<vk::Handle<(vk::HandleType)17>_> *)local_1d8,vk,device,
                 *(VkFormat *)&pOVar10[0x11]._vptr_Operation);
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)auStack_1d0._8_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)_uStack_1c0;
  local_138.m_renderSize.m_data[0] = local_1d8._0_4_;
  local_138.m_renderSize.m_data[1] = local_1d8._4_4_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = auStack_1d0._0_8_;
  local_1d8._0_4_ = R;
  local_1d8._4_4_ = SNORM_INT8;
  auStack_1d0._0_4_ = R;
  auStack_1d0._4_4_ = SNORM_INT8;
  auStack_1d0._8_8_ = (VkDevice)0x0;
  _uStack_1c0 = (VkAllocationCallbacks *)0x0;
  if (*local_1a0 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)(pOVar10 + 0x1c),(VkRenderPass)*local_1a0
              );
  }
  local_1a0[2] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_deviceIface;
  local_1a0[3] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_device;
  local_1a0->order = local_138.m_renderSize.m_data[0];
  local_1a0->type = local_138.m_renderSize.m_data[1];
  local_1a0[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_1a0[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  if ((TextureFormat)local_1d8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)17>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)17>_> *)auStack_1d0,(VkRenderPass)local_1d8);
  }
  makeFramebuffer((Move<vk::Handle<(vk::HandleType)23>_> *)local_1d8,vk,device,
                  (VkRenderPass)pOVar10[0x1b]._vptr_Operation,
                  (VkImageView)pOVar10[0x13]._vptr_Operation,
                  *(deUint32 *)((long)&pOVar10[0x19]._vptr_Operation + 4),
                  *(deUint32 *)&pOVar10[0x1a]._vptr_Operation,1);
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)auStack_1d0._8_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)_uStack_1c0;
  local_138.m_renderSize.m_data[0] = local_1d8._0_4_;
  local_138.m_renderSize.m_data[1] = local_1d8._4_4_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = auStack_1d0._0_8_;
  local_1d8._0_4_ = R;
  local_1d8._4_4_ = SNORM_INT8;
  auStack_1d0._0_4_ = R;
  auStack_1d0._4_4_ = SNORM_INT8;
  auStack_1d0._8_8_ = (VkDevice)0x0;
  _uStack_1c0 = (VkAllocationCallbacks *)0x0;
  if (*local_170 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)(pOVar10 + 0x20),
               (VkFramebuffer)*local_170);
  }
  local_170[2] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_deviceIface;
  local_170[3] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_device;
  local_170->order = local_138.m_renderSize.m_data[0];
  local_170->type = local_138.m_renderSize.m_data[1];
  local_170[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_170[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  if ((TextureFormat)local_1d8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)23>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)23>_> *)auStack_1d0,(VkFramebuffer)local_1d8);
  }
  makePipelineLayoutWithoutDescriptors((Move<vk::Handle<(vk::HandleType)16>_> *)local_1d8,vk,device)
  ;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)auStack_1d0._8_8_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.deleter.
  m_device = (VkDevice)_uStack_1c0;
  local_138.m_renderSize.m_data[0] = local_1d8._0_4_;
  local_138.m_renderSize.m_data[1] = local_1d8._4_4_;
  local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
  m_internal = auStack_1d0._0_8_;
  local_1d8._0_4_ = R;
  local_1d8._4_4_ = SNORM_INT8;
  auStack_1d0._0_8_ = (DeviceInterface *)0x0;
  auStack_1d0._8_8_ = (VkDevice)0x0;
  _uStack_1c0 = (VkAllocationCallbacks *)0x0;
  if (*local_1a8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)(pOVar10 + 0x24),
               (VkPipelineLayout)*local_1a8);
  }
  local_1a8[2] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_deviceIface;
  local_1a8[3] = (TextureFormat)
                 local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.
                 m_data.deleter.m_device;
  local_1a8->order = local_138.m_renderSize.m_data[0];
  local_1a8->type = local_138.m_renderSize.m_data[1];
  local_1a8[1].order =
       (undefined4)
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal;
  local_1a8[1].type =
       local_138.m_vertexShaderModule.super_RefBase<vk::Handle<(vk::HandleType)14>_>.m_data.object.
       m_internal._4_4_;
  if ((TextureFormat)local_1d8 != (TextureFormat)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)16>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)16>_> *)auStack_1d0,(VkPipelineLayout)local_1d8);
  }
  memset(&local_138,0,0xfc);
  local_138.m_patchControlPoints = 1;
  local_138.m_blendEnable = false;
  local_138.m_primitiveTopology = VK_PRIMITIVE_TOPOLOGY_TRIANGLE_LIST;
  local_138.m_renderSize.m_data = *(int (*) [2])((long)&pOVar10[0x19]._vptr_Operation + 4);
  pGVar12 = GraphicsPipelineBuilder::setVertexInputSingleAttribute
                      (&local_138,*(VkFormat *)&pOVar10[4]._vptr_Operation,
                       *(deUint32 *)((long)&pOVar10[4]._vptr_Operation + 4));
  pOVar8 = local_150;
  auStack_1d0._8_8_ = (VkDevice)0x7265765f77617264;
  uStack_1c0 = 0x74;
  auStack_1d0._0_8_ = (DeviceInterface *)0x9;
  local_1d8 = (undefined1  [8])((long)auStack_1d0 + 8);
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)local_150->m_progCollection,(key_type *)local_1d8);
  pGVar12 = GraphicsPipelineBuilder::setShader
                      (pGVar12,vk,device,VK_SHADER_STAGE_VERTEX_BIT,
                       *(ProgramBinary **)(cVar13._M_node + 2),(VkSpecializationInfo *)0x0);
  local_188._M_allocated_capacity = 0x6172665f77617264;
  local_188._8_2_ = 0x67;
  local_198._8_8_ = 9;
  local_198._0_8_ = &local_188;
  cVar13 = std::
           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
           ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
                   *)pOVar8->m_progCollection,(key_type *)local_198);
  GraphicsPipelineBuilder::setShader
            (pGVar12,vk,device,VK_SHADER_STAGE_FRAGMENT_BIT,*(ProgramBinary **)(cVar13._M_node + 2),
             (VkSpecializationInfo *)0x0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._0_8_ != &local_188) {
    operator_delete((void *)local_198._0_8_,(ulong)(local_188._M_allocated_capacity + 1));
  }
  pOVar8 = local_150;
  if (local_1d8 != (undefined1  [8])((long)auStack_1d0 + 8)) {
    operator_delete((void *)local_1d8,(ulong)(auStack_1d0._8_8_ + 1));
  }
  GraphicsPipelineBuilder::build
            ((Move<vk::Handle<(vk::HandleType)18>_> *)local_198,&local_138,vk,device,
             (VkPipelineLayout)*local_1a8,(VkRenderPass)*local_1a0,pOVar8->m_pipelineCacheData);
  pVVar6 = local_158;
  auStack_1d0._8_8_ = local_188._M_allocated_capacity;
  _uStack_1c0 = local_188._8_8_;
  local_1d8 = (undefined1  [8])local_198._0_8_;
  auStack_1d0._0_8_ = local_198._8_8_;
  local_198 = ZEXT816(0);
  local_188._M_allocated_capacity = 0;
  local_188._8_8_ = 0;
  if (*local_158 != (VkClearDepthStencilValue)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(pOVar10 + 0x28),(VkPipeline)*local_158);
  }
  pVVar6[2].depth = (float)auStack_1d0._8_4_;
  pVVar6[2].stencil = auStack_1d0._12_4_;
  pVVar6[3].depth = (float)_uStack_1c0;
  pVVar6[3].stencil = uStack_1be._2_4_;
  pVVar6->depth = (float)local_1d8._0_4_;
  pVVar6->stencil = local_1d8._4_4_;
  pVVar6[1].depth = (float)auStack_1d0._0_4_;
  pVVar6[1].stencil = auStack_1d0._4_4_;
  if ((VkClearDepthStencilValue)local_198._0_8_ != (VkClearDepthStencilValue)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)18>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)18>_> *)(local_198 + 8),
               (VkPipeline)local_198._0_8_);
  }
  pp_Var4 = pOVar10[2]._vptr_Operation;
  TVar14 = ::vk::mapVkFormat(*(VkFormat *)(pp_Var4 + 0xb));
  iVar9 = tcu::getPixelSize(TVar14);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (local_160,
             (ulong)(uint)(iVar9 * *(int *)(pp_Var4 + 9) * *(int *)((long)pp_Var4 + 0x4c) *
                          *(int *)(pp_Var4 + 10)));
  TVar14 = ::vk::mapVkFormat(*(VkFormat *)&pOVar10[0x11]._vptr_Operation);
  local_198._0_4_ = TVar14.order;
  local_198._4_4_ = TVar14.type;
  tcu::PixelBufferAccess::PixelBufferAccess
            ((PixelBufferAccess *)local_1d8,(TextureFormat *)local_198,
             *(int *)((long)&pOVar10[0x19]._vptr_Operation + 4),
             *(int *)&pOVar10[0x1a]._vptr_Operation,
             *(int *)((long)&pOVar10[0x1a]._vptr_Operation + 4),pOVar10[0xc]._vptr_Operation);
  local_198 = (undefined1  [16])makeClearValue(*(VkFormat *)&pOVar10[0x11]._vptr_Operation);
  clearPixelBuffer((PixelBufferAccess *)local_1d8,(VkClearValue *)local_198);
  GraphicsPipelineBuilder::~GraphicsPipelineBuilder(&local_138);
  (local_140->
  super_UniqueBase<vkt::synchronization::Operation,_de::DefaultDeleter<vkt::synchronization::Operation>_>
  ).m_data.ptr = pOVar10;
  return local_140;
}

Assistant:

de::MovePtr<Operation> build (OperationContext& context, Resource& resource) const
	{
		return de::MovePtr<Operation>(new Implementation(context, resource, m_drawCall));
	}